

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

void read_palette_colors_uv(MACROBLOCKD *xd,int bit_depth,PALETTE_MODE_INFO *pmi,aom_reader *r)

{
  uint n_colors;
  int iVar1;
  int iVar2;
  int iVar3;
  long in_RDX;
  int in_ESI;
  int i_2;
  int val;
  int delta_1;
  int i_1;
  int bits_1;
  int max_val;
  int min_bits_v;
  int delta;
  int range;
  int bits;
  int min_bits;
  int n_cached_colors;
  int i;
  int idx;
  int n_cache;
  uint16_t cached_colors [8];
  uint16_t color_cache [16];
  int n;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_70;
  int local_64;
  int local_60;
  uint16_t local_58 [8];
  uint16_t *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  MACROBLOCKD *in_stack_ffffffffffffffc8;
  
  n_colors = (uint)*(byte *)(in_RDX + 0x31);
  iVar1 = av1_get_palette_cache
                    (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  local_60 = 0;
  for (local_64 = 0; iVar3 = local_60, local_64 < iVar1 && local_60 < (int)n_colors;
      local_64 = local_64 + 1) {
    iVar3 = aom_read_bit_((aom_reader *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    if (iVar3 != 0) {
      local_58[local_60] = *(uint16_t *)(&stack0xffffffffffffffb8 + (long)local_64 * 2);
      local_60 = local_60 + 1;
    }
  }
  if (local_60 < (int)n_colors) {
    iVar1 = local_60 + 8;
    iVar2 = aom_read_literal_((aom_reader *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              in_stack_ffffffffffffff5c);
    local_60 = local_60 + 9;
    *(short *)(in_RDX + (long)iVar1 * 2) = (short)iVar2;
    if (local_60 < (int)(n_colors + 8)) {
      in_stack_ffffffffffffff64 = in_ESI + -3;
      local_70 = aom_read_literal_((aom_reader *)
                                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                   in_stack_ffffffffffffff5c);
      local_70 = in_stack_ffffffffffffff64 + local_70;
      for (; local_60 < (int)(n_colors + 8); local_60 = local_60 + 1) {
        iVar1 = aom_read_literal_((aom_reader *)
                                  CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                  in_stack_ffffffffffffff5c);
        iVar1 = clamp((uint)*(ushort *)(in_RDX + (long)(local_60 + -1) * 2) + iVar1,0,
                      (1 << ((byte)in_ESI & 0x1f)) + -1);
        *(short *)(in_RDX + (long)local_60 * 2) = (short)iVar1;
        in_stack_ffffffffffffff60 = local_70;
        iVar1 = av1_ceil_log2(0x1c1bdf);
        if (iVar1 <= in_stack_ffffffffffffff60) {
          local_70 = av1_ceil_log2(0x1c1bfc);
        }
        in_stack_ffffffffffffff5c = local_70;
      }
    }
    merge_colors((uint16_t *)(in_RDX + 0x10),local_58,n_colors,iVar3);
  }
  else {
    memcpy((void *)(in_RDX + 0x10),local_58,(long)(int)n_colors << 1);
  }
  iVar1 = aom_read_bit_((aom_reader *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
  ;
  if (iVar1 == 0) {
    for (local_94 = 0; local_94 < (int)n_colors; local_94 = local_94 + 1) {
      iVar1 = aom_read_literal_((aom_reader *)
                                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                in_stack_ffffffffffffff5c);
      *(short *)(in_RDX + (long)(local_94 + 0x10) * 2) = (short)iVar1;
    }
  }
  else {
    iVar1 = 1 << ((byte)in_ESI & 0x1f);
    aom_read_literal_((aom_reader *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff5c);
    iVar3 = aom_read_literal_((aom_reader *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              in_stack_ffffffffffffff5c);
    *(short *)(in_RDX + 0x20) = (short)iVar3;
    for (local_88 = 1; local_88 < (int)n_colors; local_88 = local_88 + 1) {
      local_8c = aom_read_literal_((aom_reader *)
                                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                   in_stack_ffffffffffffff5c);
      if ((local_8c != 0) &&
         (iVar3 = aom_read_bit_((aom_reader *)
                                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)),
         iVar3 != 0)) {
        local_8c = -local_8c;
      }
      local_90 = (uint)*(ushort *)(in_RDX + (long)(local_88 + 0xf) * 2) + local_8c;
      if (local_90 < 0) {
        local_90 = iVar1 + local_90;
      }
      if (iVar1 <= local_90) {
        local_90 = local_90 - iVar1;
      }
      *(short *)(in_RDX + (long)(local_88 + 0x10) * 2) = (short)local_90;
    }
  }
  return;
}

Assistant:

static void read_palette_colors_uv(MACROBLOCKD *const xd, int bit_depth,
                                   PALETTE_MODE_INFO *const pmi,
                                   aom_reader *r) {
  const int n = pmi->palette_size[1];
  // U channel colors.
  uint16_t color_cache[2 * PALETTE_MAX_SIZE];
  uint16_t cached_colors[PALETTE_MAX_SIZE];
  const int n_cache = av1_get_palette_cache(xd, 1, color_cache);
  int idx = 0;
  for (int i = 0; i < n_cache && idx < n; ++i)
    if (aom_read_bit(r, ACCT_STR)) cached_colors[idx++] = color_cache[i];
  if (idx < n) {
    const int n_cached_colors = idx;
    idx += PALETTE_MAX_SIZE;
    pmi->palette_colors[idx++] = aom_read_literal(r, bit_depth, ACCT_STR);
    if (idx < PALETTE_MAX_SIZE + n) {
      const int min_bits = bit_depth - 3;
      int bits = min_bits + aom_read_literal(r, 2, ACCT_STR);
      int range = (1 << bit_depth) - pmi->palette_colors[idx - 1];
      for (; idx < PALETTE_MAX_SIZE + n; ++idx) {
        assert(range >= 0);
        const int delta = aom_read_literal(r, bits, ACCT_STR);
        pmi->palette_colors[idx] = clamp(pmi->palette_colors[idx - 1] + delta,
                                         0, (1 << bit_depth) - 1);
        range -= (pmi->palette_colors[idx] - pmi->palette_colors[idx - 1]);
        bits = AOMMIN(bits, av1_ceil_log2(range));
      }
    }
    merge_colors(pmi->palette_colors + PALETTE_MAX_SIZE, cached_colors, n,
                 n_cached_colors);
  } else {
    memcpy(pmi->palette_colors + PALETTE_MAX_SIZE, cached_colors,
           n * sizeof(cached_colors[0]));
  }

  // V channel colors.
  if (aom_read_bit(r, ACCT_STR)) {  // Delta encoding.
    const int min_bits_v = bit_depth - 4;
    const int max_val = 1 << bit_depth;
    int bits = min_bits_v + aom_read_literal(r, 2, ACCT_STR);
    pmi->palette_colors[2 * PALETTE_MAX_SIZE] =
        aom_read_literal(r, bit_depth, ACCT_STR);
    for (int i = 1; i < n; ++i) {
      int delta = aom_read_literal(r, bits, ACCT_STR);
      if (delta && aom_read_bit(r, ACCT_STR)) delta = -delta;
      int val = (int)pmi->palette_colors[2 * PALETTE_MAX_SIZE + i - 1] + delta;
      if (val < 0) val += max_val;
      if (val >= max_val) val -= max_val;
      pmi->palette_colors[2 * PALETTE_MAX_SIZE + i] = val;
    }
  } else {
    for (int i = 0; i < n; ++i) {
      pmi->palette_colors[2 * PALETTE_MAX_SIZE + i] =
          aom_read_literal(r, bit_depth, ACCT_STR);
    }
  }
}